

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

int __thiscall
cmCTestTestHandler::ExecuteCommands
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  reference pbVar4;
  char *pcVar5;
  string local_380 [32];
  ostringstream local_360 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream cmCTestLog_msg;
  int local_3c;
  iterator iStack_38;
  int retVal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_local;
  cmCTestTestHandler *this_local;
  
  it._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vec;
  __gnu_cxx::
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(&local_28);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(it._M_current);
  local_28._M_current = local_30;
  while( true ) {
    iStack_38 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(it._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffc8);
    if (!bVar2) {
      return 1;
    }
    local_3c = 0;
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar3 = std::operator<<((ostream *)local_1b8,"Run command: ");
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_28);
    poVar3 = std::operator<<(poVar3,(string *)pbVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x535,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_28);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmSystemTools::RunSingleCommand
                      (pcVar5,(string *)0x0,(string *)0x0,&local_3c,(char *)0x0,OUTPUT_MERGE,0.0);
    if ((!bVar2) || (local_3c != 0)) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  std::__cxx11::ostringstream::ostringstream(local_360);
  poVar3 = std::operator<<((ostream *)local_360,"Problem running command: ");
  pbVar4 = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_28);
  poVar3 = std::operator<<(poVar3,(string *)pbVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x53b,pcVar5,false);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::ostringstream::~ostringstream(local_360);
  return 0;
}

Assistant:

int cmCTestTestHandler::ExecuteCommands(std::vector<std::string>& vec)
{
  std::vector<std::string>::iterator it;
  for ( it = vec.begin(); it != vec.end(); ++it )
    {
    int retVal = 0;
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Run command: " <<
      *it << std::endl, this->Quiet);
    if ( !cmSystemTools::RunSingleCommand(it->c_str(), 0, 0, &retVal, 0,
                                          cmSystemTools::OUTPUT_MERGE
        /*this->Verbose*/) || retVal != 0 )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Problem running command: "
        << *it << std::endl);
      return 0;
      }
    }
  return 1;
}